

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O0

float __thiscall nv::FloatImage::sampleNearestRepeat(FloatImage *this,float x,float y,int c)

{
  uint x_00;
  uint y_00;
  float fVar1;
  int iy;
  int ix;
  int c_local;
  float y_local;
  float x_local;
  FloatImage *this_local;
  
  fVar1 = anon_unknown.dwarf_46676e::frac(x);
  x_00 = anon_unknown.dwarf_46676e::iround(fVar1 * (float)this->m_width);
  fVar1 = anon_unknown.dwarf_46676e::frac(y);
  y_00 = anon_unknown.dwarf_46676e::iround(fVar1 * (float)this->m_height);
  fVar1 = pixel(this,x_00,y_00,c);
  return fVar1;
}

Assistant:

float FloatImage::sampleNearestRepeat(const float x, const float y, const int c) const
{
	int ix = iround(frac(x) * m_width);
	int iy = iround(frac(y) * m_height);
	return pixel(ix, iy, c);
}